

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int __thiscall
CVmObjFileName::getp_removeDirectory
          (CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t access;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  vm_val_t *pvVar5;
  int *in_RCX;
  int remove_contents;
  err_frame_t err_cur__;
  CVmNetFile *netfile;
  vm_rcdesc rc;
  uint argc;
  vm_val_t *in_stack_fffffffffffffe68;
  CVmNetFile *in_stack_fffffffffffffe70;
  void *pvVar6;
  vm_val_t *in_stack_fffffffffffffe78;
  undefined8 uVar7;
  os_filetype_t in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe8c;
  uint uVar8;
  uint local_170;
  vm_obj_id_t in_stack_fffffffffffffe94;
  void *local_160;
  __jmp_buf_tag _Stack_158;
  CVmNetFile *local_90;
  int local_2c;
  
  if (in_RCX == (int *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = *in_RCX;
  }
  local_2c = iVar2;
  if ((getp_removeDirectory(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_removeDirectory(unsigned_int,vm_val_t*,unsigned_int*)::desc)
     , iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_removeDirectory::desc,0,1);
    __cxa_guard_release(&getp_removeDirectory(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffe78,(uint *)in_stack_fffffffffffffe70,
                     (CVmNativeCodeDesc *)in_stack_fffffffffffffe68);
  if (iVar1 == 0) {
    access = CVmMetaclass::get_class_obj
                       ((CVmMetaclass *)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              ((vm_rcdesc *)CONCAT44(access,in_stack_fffffffffffffe80),
               (char *)in_stack_fffffffffffffe78,
               (vm_obj_id_t)((ulong)in_stack_fffffffffffffe70 >> 0x20),
               (unsigned_short)((ulong)in_stack_fffffffffffffe70 >> 0x10),in_stack_fffffffffffffe68,
               0);
    local_90 = CVmObjFile::get_filename_from_obj
                         (in_stack_fffffffffffffe94,
                          (vm_rcdesc *)CONCAT44(in_stack_fffffffffffffe8c,iVar2),access,
                          in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    uVar7 = *puVar3;
    plVar4 = (long *)_ZTW11G_err_frame();
    *plVar4 = (long)&local_170;
    local_170 = _setjmp(&_Stack_158);
    if (local_170 == 0) {
      uVar8 = 0;
      if (local_2c != 0) {
        pvVar5 = CVmStack::get(0);
        iVar2 = vm_val_t::is_logical(pvVar5);
        if (iVar2 == 0) {
          err_throw(0);
        }
        pvVar5 = CVmStack::get(0);
        uVar8 = vm_val_t::get_logical(pvVar5);
      }
      CVmNetFile::rmdir(local_90,(char *)(ulong)uVar8);
    }
    if ((local_170 & 0x8000) == 0) {
      local_170 = local_170 | 0x8000;
      CVmNetFile::abandon(in_stack_fffffffffffffe70);
    }
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    *puVar3 = uVar7;
    if ((local_170 & 0x4001) != 0) {
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar3 & 2) != 0) {
        plVar4 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar4 + 0x10));
      }
      pvVar6 = local_160;
      plVar4 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar4 + 0x10) = pvVar6;
      err_rethrow();
    }
    if ((local_170 & 2) != 0) {
      free(local_160);
    }
    CVmStack::discard(local_2c);
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_removeDirectory(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use RMDIR access mode */
    vm_rcdesc rc(vmg_ "FileName.removeDirectory",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_REMOVEDIR, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_RMDIR,
        OSFTUNK, "application/octet-stream");

    err_try
    {
        /* get the "remove contents" parameter */
        int remove_contents = FALSE;
        if (argc >= 1)
        {
            /* check that it's a true/nil value */
            if (!G_stk->get(0)->is_logical())
                err_throw(VMERR_BAD_TYPE_BIF);

            /* retrieve the flag */
            remove_contents = G_stk->get(0)->get_logical();
        }

        /* remove the directory */
        netfile->rmdir(vmg_ remove_contents);
    }